

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  string input;
  Options options;
  CompileContext context;
  undefined1 *local_3a0;
  long local_398;
  undefined1 local_390;
  undefined7 uStack_38f;
  string local_380;
  Options local_360;
  Options local_2b8;
  CompileContext local_210;
  
  enact::Options::Options(&local_2b8,argc,argv);
  enact::Options::Options(&local_360,&local_2b8);
  enact::CompileContext::CompileContext(&local_210,&local_360);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_360.m_parseTable._M_h);
  std::
  _Hashtable<enact::Flag,_enact::Flag,_std::allocator<enact::Flag>,_std::__detail::_Identity,_std::equal_to<enact::Flag>,_std::hash<enact::Flag>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_360.m_flags._M_h);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_360.m_programArgs);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360.m_filename._M_dataplus._M_p != &local_360.m_filename.field_2) {
    operator_delete(local_360.m_filename._M_dataplus._M_p,
                    local_360.m_filename.field_2._M_allocated_capacity + 1);
  }
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"enact > ",8);
    local_398 = 0;
    local_390 = 0;
    local_3a0 = &local_390;
    cVar1 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + '\x18');
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&local_3a0,cVar1);
    local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_380,local_3a0,local_3a0 + local_398);
    enact::CompileContext::compile(&local_210,&local_380);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
    }
    if (local_3a0 != &local_390) {
      operator_delete(local_3a0,CONCAT71(uStack_38f,local_390) + 1);
    }
  } while( true );
}

Assistant:

int main(int argc, char *argv[]) {
    //enact::Options options{argc, argv};
    //enact::CompileContext context{options};

    //return static_cast<int>(context.run());

    enact::Options options{argc, argv};
    enact::CompileContext context{options};

    while (true) {
        std::cout << "enact > ";
        std::string input;
        std::getline(std::cin, input);

        context.compile(input);
    }
}